

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeprovider.cpp
# Opt level: O0

Type * __thiscall stackjit::TypeProvider::makeType(TypeProvider *this,string *name)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *ppTVar4;
  reference pvVar5;
  Type *pTVar6;
  size_type sVar7;
  ClassType *pCVar8;
  ClassMetadata *metadata;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>
  local_180;
  undefined1 local_151;
  string local_150 [32];
  ulong local_130;
  size_t i;
  string local_120 [6];
  bool isFirst;
  string className;
  string local_100 [32];
  Type *local_e0;
  Type *elementType;
  string local_b8 [8];
  string elementTypeName;
  string local_98 [39];
  PrimitiveTypes local_71;
  ClassType *pCStack_70;
  PrimitiveTypes primitiveType;
  Type *type;
  string local_58 [32];
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  typeParts;
  string *name_local;
  TypeProvider *this_local;
  
  typeParts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = name;
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>_>
          ::count(&this->mTypes,name);
  if (sVar3 == 0) {
    std::__cxx11::string::string(local_58,(string *)name);
    anon_unknown.dwarf_15f65f::splitTypeName
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    pCStack_70 = (ClassType *)0x0;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,0);
    std::__cxx11::string::string(local_98,(string *)pvVar5);
    bVar2 = TypeSystem::fromString((string *)local_98,&local_71);
    std::__cxx11::string::~string(local_98);
    if (bVar2) {
      pCVar8 = (ClassType *)operator_new(0x28);
      PrimitiveType::PrimitiveType((PrimitiveType *)pCVar8,local_71);
      pCStack_70 = pCVar8;
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,0);
      bVar2 = std::operator==(pvVar5,"Ref");
      if (bVar2) {
        std::__cxx11::string::string(local_b8);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_38,1);
        std::__cxx11::string::string((string *)&elementType,(string *)pvVar5);
        bVar2 = anon_unknown.dwarf_15f65f::extractElementType
                          ((string *)&elementType,(string *)local_b8);
        std::__cxx11::string::~string((string *)&elementType);
        if (bVar2) {
          std::__cxx11::string::string(local_100,local_b8);
          pTVar6 = makeType(this,(string *)local_100);
          std::__cxx11::string::~string(local_100);
          local_e0 = pTVar6;
          if (pTVar6 != (Type *)0x0) {
            pCVar8 = (ClassType *)operator_new(0x30);
            ArrayType::ArrayType((ArrayType *)pCVar8,local_e0);
            pCStack_70 = pCVar8;
          }
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,1);
          bVar2 = std::operator==(pvVar5,"Null");
          if (bVar2) {
            pCVar8 = (ClassType *)operator_new(0x28);
            NullReferenceType::NullReferenceType((NullReferenceType *)pCVar8);
            pCStack_70 = pCVar8;
          }
          else {
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_38);
            if (1 < sVar7) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_120,"",(allocator *)((long)&i + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
              i._6_1_ = 1;
              for (local_130 = 1; uVar1 = local_130,
                  sVar7 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_38), uVar1 < sVar7; local_130 = local_130 + 1) {
                if ((i._6_1_ & 1) == 0) {
                  std::__cxx11::string::operator+=(local_120,".");
                }
                else {
                  i._6_1_ = 0;
                }
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_38,local_130);
                std::__cxx11::string::operator+=(local_120,(string *)pvVar5);
              }
              bVar2 = ClassMetadataProvider::isDefined(this->mClassProvider,(string *)local_120);
              if (bVar2) {
                pCVar8 = (ClassType *)operator_new(0x50);
                local_151 = 1;
                std::__cxx11::string::string(local_150,local_120);
                metadata = ClassMetadataProvider::getMetadata
                                     (this->mClassProvider,(string *)local_120);
                ClassType::ClassType(pCVar8,(string *)local_150,metadata);
                local_151 = 0;
                pCStack_70 = pCVar8;
                std::__cxx11::string::~string(local_150);
              }
              std::__cxx11::string::~string(local_120);
            }
          }
        }
        std::__cxx11::string::~string(local_b8);
      }
    }
    if (pCStack_70 != (ClassType *)0x0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_stackjit::Type_*&,_true>
                (&local_180,name,(Type **)&stack0xffffffffffffff90);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>_>
      ::insert(&this->mTypes,&local_180);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>
      ::~pair(&local_180);
    }
    this_local = (TypeProvider *)pCStack_70;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
  }
  else {
    ppTVar4 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>_>
              ::operator[](&this->mTypes,name);
    this_local = (TypeProvider *)*ppTVar4;
  }
  return (Type *)this_local;
}

Assistant:

const Type* TypeProvider::makeType(std::string name) {
		if (mTypes.count(name) > 0) {
			return mTypes[name];
		}

		//Split the type name
		auto typeParts = splitTypeName(name);
		Type* type = nullptr;

		PrimitiveTypes primitiveType;
		if (TypeSystem::fromString(typeParts.at(0), primitiveType)) {
			type = new PrimitiveType(primitiveType);
		} else if (typeParts.at(0) == "Ref") {
			std::string elementTypeName;
			if (extractElementType(typeParts.at(1), elementTypeName)) {
				auto elementType = makeType(elementTypeName);

				if (elementType != nullptr) {
					type = new ArrayType(elementType);
				}
			} else if (typeParts.at(1) == "Null") {
				type = new NullReferenceType();
			} else {
				if (typeParts.size() >= 2) {
					std::string className = "";
					bool isFirst = true;

					for (std::size_t i = 1; i < typeParts.size(); i++) {
						if (isFirst) {
							isFirst = false;
						} else {
							className += ".";
						}

						className += typeParts.at(i);
					}

					if (mClassProvider.isDefined(className)) {
						type = new ClassType(className, &mClassProvider.getMetadata(className));
					}
				}
			}
		}

		if (type != nullptr) {
			mTypes.insert({ name, type });
		}

		return type;
	}